

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O3

void ARKodeButcherTable_Free(ARKodeButcherTable B)

{
  int iVar1;
  realtype **__ptr;
  long lVar2;
  
  if (B != (ARKodeButcherTable)0x0) {
    if (B->d != (realtype *)0x0) {
      free(B->d);
    }
    if (B->c != (realtype *)0x0) {
      free(B->c);
    }
    if (B->b != (realtype *)0x0) {
      free(B->b);
    }
    __ptr = B->A;
    if (__ptr != (realtype **)0x0) {
      iVar1 = B->stages;
      if (0 < iVar1) {
        lVar2 = 0;
        do {
          if (B->A[lVar2] != (realtype *)0x0) {
            free(B->A[lVar2]);
            iVar1 = B->stages;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < iVar1);
        __ptr = B->A;
      }
      free(__ptr);
    }
    free(B);
    return;
  }
  return;
}

Assistant:

void ARKodeButcherTable_Free(ARKodeButcherTable B)
{
  int i;

  /* Free each field within Butcher table structure, and then
     free structure itself */
  if (B != NULL) {
    if (B->d != NULL)  free(B->d);
    if (B->c != NULL)  free(B->c);
    if (B->b != NULL)  free(B->b);
    if (B->A != NULL) {
      for (i=0; i<B->stages; i++)
        if (B->A[i] != NULL)  free(B->A[i]);
      free(B->A);
    }

    free(B);
  }
}